

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::ConsoleReporter::log_contexts(ConsoleReporter *this)

{
  int iVar1;
  IContextScope **ppIVar2;
  ostream *poVar3;
  char *pcVar4;
  long in_RDI;
  int i;
  IContextScope **contexts;
  int num_contexts;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  iVar1 = IReporter::get_num_active_contexts();
  if (iVar1 != 0) {
    ppIVar2 = IReporter::get_active_contexts();
    poVar3 = Color::operator<<((ostream *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                               (Enum)((ulong)in_RDI >> 0x20));
    std::operator<<(poVar3,"  logged: ");
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pcVar4 = "          ";
      if (iVar5 == 0) {
        pcVar4 = "";
      }
      std::operator<<(*(ostream **)(in_RDI + 8),pcVar4);
      (*ppIVar2[iVar5]->_vptr_IContextScope[2])(ppIVar2[iVar5],*(undefined8 *)(in_RDI + 8));
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    }
  }
  std::operator<<(*(ostream **)(in_RDI + 8),"\n");
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << Color::None << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << "\n";
                }
            }

            s << "\n";
        }